

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

void BinaryenMemoryInitSetSize(BinaryenExpressionRef expr,BinaryenExpressionRef sizeExpr)

{
  if (expr->_id != MemoryInitId) {
    __assert_fail("expression->is<MemoryInit>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xdb2,
                  "void BinaryenMemoryInitSetSize(BinaryenExpressionRef, BinaryenExpressionRef)");
  }
  if (sizeExpr != (BinaryenExpressionRef)0x0) {
    *(BinaryenExpressionRef *)(expr + 3) = sizeExpr;
    return;
  }
  __assert_fail("sizeExpr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xdb3,
                "void BinaryenMemoryInitSetSize(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenMemoryInitSetSize(BinaryenExpressionRef expr,
                               BinaryenExpressionRef sizeExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<MemoryInit>());
  assert(sizeExpr);
  static_cast<MemoryInit*>(expression)->size = (Expression*)sizeExpr;
}